

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O1

ReadThreadsGraph * __thiscall
LongReadsRecruiter::rtg_from_threads
          (ReadThreadsGraph *__return_storage_ptr__,LongReadsRecruiter *this,bool remove_duplicated,
          int min_thread_nodes)

{
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *this_00;
  SequenceDistanceGraph *_sdg;
  pointer pvVar1;
  pointer pNVar2;
  vector<NodePosition,_std::allocator<NodePosition>_> *t;
  ulong uVar3;
  pointer pvVar4;
  long lVar5;
  pointer pNVar6;
  long lVar7;
  ulong uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_counts;
  allocator_type local_59;
  string local_58;
  int local_34;
  
  _sdg = this->sdg;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_34 = min_thread_nodes;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"RTG","");
  DistanceGraph::DistanceGraph(&__return_storage_ptr__->super_DistanceGraph,_sdg,&local_58);
  (__return_storage_ptr__->thread_info)._M_h._M_buckets =
       &(__return_storage_ptr__->thread_info)._M_h._M_single_bucket;
  (__return_storage_ptr__->thread_info)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->thread_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->thread_info)._M_h._M_element_count = 0;
  (__return_storage_ptr__->thread_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->thread_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->thread_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_buckets =
       &(__return_storage_ptr__->node_proximal_nodes)._M_h._M_single_bucket;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
  ;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_element_count = 0;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->node_proximal_nodes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
             ((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_59);
  pvVar1 = (this->read_threads).
           super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (this->read_threads).
                super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar1; pvVar4 = pvVar4 + 1) {
    pNVar2 = (pvVar4->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pNVar6 = (pvVar4->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                  super__Vector_impl_data._M_start; pNVar6 != pNVar2; pNVar6 = pNVar6 + 1) {
      lVar5 = pNVar6->node;
      lVar7 = -lVar5;
      if (0 < lVar5) {
        lVar7 = lVar5;
      }
      *(long *)(local_58._M_dataplus._M_p + lVar7 * 8) =
           *(long *)(local_58._M_dataplus._M_p + lVar7 * 8) + 1;
    }
  }
  this_00 = &(__return_storage_ptr__->super_DistanceGraph).links;
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::resize(this_00,(long)(local_58._M_string_length - (long)local_58._M_dataplus._M_p) >> 3);
  if (8 < local_58._M_string_length - (long)local_58._M_dataplus._M_p) {
    uVar8 = 1;
    lVar5 = 0x18;
    do {
      std::vector<Link,_std::allocator<Link>_>::reserve
                ((vector<Link,_std::allocator<Link>_> *)
                 ((long)&(((this_00->
                           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                         super__Vector_impl_data + lVar5),
                 *(long *)(local_58._M_dataplus._M_p + uVar8 * 8) * 2);
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar8 < (ulong)((long)(local_58._M_string_length - (long)local_58._M_dataplus._M_p) >>
                            3));
  }
  pvVar4 = (this->read_threads).
           super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->read_threads).
                         super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                 -0x5555555555555555)) {
    uVar8 = 1;
    lVar5 = 0x18;
    do {
      ReadThreadsGraph::add_thread
                (__return_storage_ptr__,uVar8,
                 (vector<NodePosition,_std::allocator<NodePosition>_> *)
                 ((long)&(pvVar4->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                         _M_impl.super__Vector_impl_data + lVar5),remove_duplicated,local_34);
      uVar8 = uVar8 + 1;
      pvVar4 = (this->read_threads).
               super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->read_threads).
                     super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
              -0x5555555555555555;
      lVar5 = lVar5 + 0x18;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ReadThreadsGraph LongReadsRecruiter::rtg_from_threads(bool remove_duplicated, int min_thread_nodes) {
    ReadThreadsGraph rtg(sdg);
    std::vector<uint64_t> node_counts(sdg.nodes.size());
    for (auto const &t:read_threads) {
        for (auto const &np:t ) ++node_counts[llabs(np.node)];
    }
    rtg.links.resize(node_counts.size());
    for (uint64_t i=1;i<node_counts.size();++i) rtg.links[i].reserve(2*node_counts[i]);
    for (auto rid=1;rid<read_threads.size();++rid) {
        rtg.add_thread(rid,read_threads[rid],remove_duplicated,min_thread_nodes);
    }
    return rtg;
}